

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O1

void __thiscall hanabi_learning_env::HanabiState::ApplyMove(HanabiState *this,HanabiMove move)

{
  int *piVar1;
  pointer *ppHVar2;
  int iVar3;
  pointer piVar4;
  pointer pHVar5;
  pointer pHVar6;
  pointer pHVar7;
  iterator __position;
  bool bVar8;
  uint8_t uVar9;
  pair<bool,_bool> pVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *discard_pile;
  int iVar16;
  HanabiCard card;
  pointer pHVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  CardKnowledge card_knowledge;
  undefined1 local_98 [9];
  undefined1 auStack_8f [2];
  int8_t iStack_8d;
  int8_t iStack_8c;
  undefined1 uStack_8b;
  undefined2 uStack_8a;
  CardKnowledge local_88;
  
  bVar8 = MoveIsLegal(this,move);
  if (!bVar8) {
    __assert_fail("MoveIsLegal(move)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                  ,0xde,"void hanabi_learning_env::HanabiState::ApplyMove(HanabiMove)");
  }
  if ((this->deck_).total_count_ == 0) {
    this->turns_to_play_ = this->turns_to_play_ + -1;
  }
  iVar11 = this->cur_player_;
  _auStack_8f = 0xff0000ffff0000;
  local_98[8] = (int8_t)iVar11;
  cVar21 = move.color_;
  cVar20 = move.rank_;
  cVar19 = move.card_index_;
  local_98._0_8_ = move;
  switch(move.move_type_) {
  case kPlay:
    lVar13 = *(long *)&(this->hands_).
                       super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar11].cards_.
                       super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                       ._M_impl;
    lVar12 = (long)cVar19;
    iStack_8d = *(int8_t *)(lVar13 + lVar12 * 8);
    iStack_8c = *(int8_t *)(lVar13 + 4 + lVar12 * 8);
    _uStack_8b = 0xff0000;
    pVar10 = AddToFireworks(this,*(HanabiCard *)(lVar13 + lVar12 * 8));
    auStack_8f = (undefined1  [2])pVar10;
    pHVar17 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start + this->cur_player_;
    discard_pile = (vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                    *)0x0;
    if (((ushort)pVar10 & 1) == 0) {
      discard_pile = &this->discard_pile_;
    }
    break;
  case kDiscard:
    iVar16 = this->information_tokens_;
    iVar3 = this->parent_game_->max_information_tokens_;
    if (iVar16 < iVar3) {
      this->information_tokens_ = iVar16 + 1;
    }
    auStack_8f[1] = iVar16 < iVar3;
    pHVar7 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar17 = pHVar7 + iVar11;
    lVar13 = *(long *)&pHVar7[iVar11].cards_.
                       super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                       ._M_impl;
    iStack_8d = *(int8_t *)(lVar13 + (long)cVar19 * 8);
    iStack_8c = *(int8_t *)(lVar13 + 4 + (long)cVar19 * 8);
    _uStack_8b = 0xff0000;
    discard_pile = &this->discard_pile_;
    break;
  case kRevealColor:
    if (this->information_tokens_ < 1) {
LAB_0010e77d:
      __assert_fail("information_tokens_ > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                    ,0x7b,"void hanabi_learning_env::HanabiState::DecrementInformationTokens()");
    }
    this->information_tokens_ = this->information_tokens_ + -1;
    pHVar17 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = (ulong)(long)(move.target_offset_ + iVar11) %
             (ulong)(((long)(this->hands_).
                            super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar17 >> 4) *
                    -0x5555555555555555);
    pHVar5 = *(pointer *)
              &pHVar17[uVar14].cards_.
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl;
    pHVar6 = *(pointer *)
              ((long)&pHVar17[uVar14].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl + 8);
    uVar15 = (long)pHVar6 - (long)pHVar5 >> 3;
    if (8 < uVar15) {
      __assert_fail("cards.size() <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                    ,0x1e,
                    "uint8_t hanabi_learning_env::(anonymous namespace)::HandColorBitmask(const HanabiHand &, int)"
                   );
    }
    if (pHVar6 == pHVar5) {
      uStack_8b = 0;
    }
    else {
      lVar13 = 0;
      uStack_8b = 0;
      do {
        bVar18 = (byte)(1 << ((byte)lVar13 & 0x1f));
        if (pHVar5[lVar13].color_ != (int)cVar21) {
          bVar18 = 0;
        }
        uStack_8b = uStack_8b | bVar18;
        lVar13 = lVar13 + 1;
      } while (uVar15 + (uVar15 == 0) != lVar13);
    }
    uStack_8a = 0xff00;
    uVar9 = HanabiHand::RevealColor(pHVar17 + uVar14,(int)cVar21);
    goto LAB_0010e721;
  case kRevealRank:
    if (this->information_tokens_ < 1) goto LAB_0010e77d;
    this->information_tokens_ = this->information_tokens_ + -1;
    pHVar17 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = (ulong)(long)(move.target_offset_ + iVar11) %
             (ulong)(((long)(this->hands_).
                            super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar17 >> 4) *
                    -0x5555555555555555);
    pHVar5 = *(pointer *)
              &pHVar17[uVar14].cards_.
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl;
    pHVar6 = *(pointer *)
              ((long)&pHVar17[uVar14].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl + 8);
    uVar15 = (long)pHVar6 - (long)pHVar5 >> 3;
    if (8 < uVar15) {
      __assert_fail("cards.size() <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                    ,0x2b,
                    "uint8_t hanabi_learning_env::(anonymous namespace)::HandRankBitmask(const HanabiHand &, int)"
                   );
    }
    if (pHVar6 == pHVar5) {
      uStack_8b = 0;
    }
    else {
      lVar13 = 0;
      uStack_8b = 0;
      do {
        bVar18 = (byte)(1 << ((byte)lVar13 & 0x1f));
        if (pHVar5[lVar13].rank_ != (int)cVar20) {
          bVar18 = 0;
        }
        uStack_8b = uStack_8b | bVar18;
        lVar13 = lVar13 + 1;
      } while (uVar15 + (uVar15 == 0) != lVar13);
    }
    uStack_8a = 0xff00;
    uVar9 = HanabiHand::RevealRank(pHVar17 + uVar14,(int)cVar20);
LAB_0010e721:
    uStack_8a._0_1_ = uVar9;
    goto LAB_0010e725;
  case kDeal:
    iVar11 = PlayerToDeal(this);
    uStack_8a._1_1_ = (int8_t)iVar11;
    HanabiHand::CardKnowledge::CardKnowledge
              (&local_88,this->parent_game_->num_colors_,this->parent_game_->num_ranks_);
    if (this->parent_game_->observation_type_ == kSeer) {
      HanabiHand::ValueKnowledge::ApplyIsValueHint(&local_88.color_,(int)cVar21);
      HanabiHand::ValueKnowledge::ApplyIsValueHint(&local_88.rank_,(int)cVar20);
    }
    pHVar17 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar16 = (int)cVar21 * (this->deck_).num_ranks_ + (int)cVar20;
    piVar4 = (this->deck_).card_count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = piVar4[iVar16];
    if (iVar11 < 1) {
      card.color_ = -1;
      card.rank_ = -1;
    }
    else {
      piVar4[iVar16] = iVar11 + -1;
      piVar1 = &(this->deck_).total_count_;
      *piVar1 = *piVar1 + -1;
      lVar13 = (long)(this->deck_).num_ranks_;
      card = (HanabiCard)((long)iVar16 / lVar13 & 0xffffffffU | (long)iVar16 % lVar13 << 0x20);
    }
    HanabiHand::AddCard(pHVar17 + uStack_8a._1_1_,card,&local_88);
    if (local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_88.rank_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_88.color_.value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    goto LAB_0010e725;
  default:
    abort();
  }
  HanabiHand::RemoveFromHand(pHVar17,(int)cVar19,discard_pile);
LAB_0010e725:
  __position._M_current =
       (this->move_history_).
       super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->move_history_).
      super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<hanabi_learning_env::HanabiHistoryItem,std::allocator<hanabi_learning_env::HanabiHistoryItem>>
    ::_M_realloc_insert<hanabi_learning_env::HanabiHistoryItem_const&>
              ((vector<hanabi_learning_env::HanabiHistoryItem,std::allocator<hanabi_learning_env::HanabiHistoryItem>>
                *)&this->move_history_,__position,(HanabiHistoryItem *)local_98);
  }
  else {
    ((__position._M_current)->move).move_type_ = local_98._0_4_;
    ((__position._M_current)->move).card_index_ = local_98[4];
    ((__position._M_current)->move).target_offset_ = local_98[5];
    ((__position._M_current)->move).color_ = local_98[6];
    ((__position._M_current)->move).rank_ = local_98[7];
    (__position._M_current)->player = local_98[8];
    (__position._M_current)->scored = auStack_8f[0];
    (__position._M_current)->information_token = auStack_8f[1];
    (__position._M_current)->color = iStack_8d;
    (__position._M_current)->rank = iStack_8c;
    (__position._M_current)->reveal_bitmask = uStack_8b;
    (__position._M_current)->newly_revealed_bitmask = (uint8_t)uStack_8a;
    (__position._M_current)->deal_to_player = uStack_8a._1_1_;
    ppHVar2 = &(this->move_history_).
               super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppHVar2 = *ppHVar2 + 1;
  }
  AdvanceToNextPlayer(this);
  return;
}

Assistant:

void HanabiState::ApplyMove(HanabiMove move) {
  REQUIRE(MoveIsLegal(move));
  if (deck_.Empty()) {
    --turns_to_play_;
  }
  HanabiHistoryItem history(move);
  history.player = cur_player_;
  switch (move.MoveType()) {
    case HanabiMove::kDeal: {
        history.deal_to_player = PlayerToDeal();
        HanabiHand::CardKnowledge card_knowledge(ParentGame()->NumColors(),
                                      ParentGame()->NumRanks());
        if (parent_game_->ObservationType() == HanabiGame::kSeer){
          card_knowledge.ApplyIsColorHint(move.Color());
          card_knowledge.ApplyIsRankHint(move.Rank());
        }
        hands_[history.deal_to_player].AddCard(
            deck_.DealCard(move.Color(), move.Rank()),
            card_knowledge);
      }
      break;
    case HanabiMove::kDiscard:
      history.information_token = IncrementInformationTokens();
      history.color = hands_[cur_player_].Cards()[move.CardIndex()].Color();
      history.rank = hands_[cur_player_].Cards()[move.CardIndex()].Rank();
      hands_[cur_player_].RemoveFromHand(move.CardIndex(), &discard_pile_);
      break;
    case HanabiMove::kPlay:
      history.color = hands_[cur_player_].Cards()[move.CardIndex()].Color();
      history.rank = hands_[cur_player_].Cards()[move.CardIndex()].Rank();
      std::tie(history.scored, history.information_token) =
          AddToFireworks(hands_[cur_player_].Cards()[move.CardIndex()]);
      hands_[cur_player_].RemoveFromHand(
          move.CardIndex(), history.scored ? nullptr : &discard_pile_);
      break;
    case HanabiMove::kRevealColor:
      DecrementInformationTokens();
      history.reveal_bitmask =
          HandColorBitmask(*HandByOffset(move.TargetOffset()), move.Color());
      history.newly_revealed_bitmask =
          HandByOffset(move.TargetOffset())->RevealColor(move.Color());
      break;
    case HanabiMove::kRevealRank:
      DecrementInformationTokens();
      history.reveal_bitmask =
          HandRankBitmask(*HandByOffset(move.TargetOffset()), move.Rank());
      history.newly_revealed_bitmask =
          HandByOffset(move.TargetOffset())->RevealRank(move.Rank());
      break;
    default:
      std::abort();  // Should not be possible.
  }
  move_history_.push_back(history);
  AdvanceToNextPlayer();
}